

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mipmapped_texture::qdxt_pack_init
          (mipmapped_texture *this,qdxt_state *state,mipmapped_texture *dst_tex,
          qdxt1_params *dxt1_params,qdxt5_params *dxt5_params,pixel_format fmt,bool cook)

{
  uint *this_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  orientation_flags_t flags;
  uint uVar4;
  dynamic_string *this_01;
  mip_level *this_02;
  mip_level *this_03;
  image_u8 *other;
  mip_desc *pmVar5;
  mip_desc *pmVar6;
  color_quad<unsigned_char,_int> *other_00;
  uint local_120;
  uint local_11c;
  uint bx;
  uint by;
  color_quad_u8 *pDst_pixel;
  uint img_x;
  uint block_x;
  uint img_y;
  uint block_y;
  mip_desc *mip_desc_1;
  uint i;
  mip_desc *mip_desc;
  dxt_pixel_block *pDst_blocks;
  uint cur_size;
  uint total_blocks;
  uint num_blocks_y;
  uint num_blocks_x;
  undefined1 local_c0 [8];
  image_u8 img;
  image_u8 tmp_img;
  mip_level *pLevel;
  uint local_50;
  uint l;
  uint f;
  conversion_type cook_conv_type;
  uint cur_progress_start;
  uint num_elements;
  bool cook_local;
  pixel_format fmt_local;
  qdxt5_params *dxt5_params_local;
  qdxt1_params *dxt1_params_local;
  mipmapped_texture *dst_tex_local;
  qdxt_state *state_local;
  mipmapped_texture *this_local;
  
  bVar1 = is_valid(this);
  if (!bVar1) {
    return false;
  }
  memcpy(&state->m_qdxt1_params,dxt1_params,0x630);
  memcpy(state->m_qdxt5_params,dxt5_params,0x62d);
  memcpy(state->m_qdxt5_params + 1,dxt5_params,0x62d);
  utils::zero_object<bool[3]>(&state->m_has_blocks);
  if (fmt == PIXEL_FMT_ETC1) goto LAB_0014e09f;
  if (fmt == PIXEL_FMT_DXT5A) {
    state->m_has_blocks[1] = true;
    state->m_qdxt5_params[0].m_comp_index = 3;
  }
  else if (fmt == PIXEL_FMT_DXT1) {
    state->m_has_blocks[0] = true;
  }
  else {
    if (fmt == PIXEL_FMT_ETC2) goto LAB_0014e09f;
    if (fmt == PIXEL_FMT_3DC) {
      state->m_has_blocks[1] = true;
      state->m_has_blocks[2] = true;
      state->m_qdxt5_params[0].m_comp_index = 1;
      state->m_qdxt5_params[1].m_comp_index = 0;
    }
    else if ((fmt == PIXEL_FMT_DXT4) || (fmt == PIXEL_FMT_DXT5)) {
      state->m_has_blocks[0] = true;
      state->m_has_blocks[1] = true;
      (state->m_qdxt1_params).m_use_alpha_blocks = false;
      state->m_qdxt5_params[0].m_comp_index = 3;
    }
    else if (fmt == PIXEL_FMT_DXT1A) {
      state->m_has_blocks[0] = true;
      (state->m_qdxt1_params).m_use_alpha_blocks = true;
    }
    else {
      if (fmt == PIXEL_FMT_ETC2A) {
LAB_0014e09f:
        console::warning("mipmapped_texture::qdxt_pack_init: This method does not support ETCn");
        return false;
      }
      if (((fmt != PIXEL_FMT_DXT5_AGBR) && (fmt != PIXEL_FMT_DXT5_xGBR)) &&
         (fmt != PIXEL_FMT_DXT5_xGxR)) {
        if ((fmt == PIXEL_FMT_ETC1S) || (fmt == PIXEL_FMT_ETC2AS)) goto LAB_0014e09f;
        if (fmt == PIXEL_FMT_DXN) {
          state->m_has_blocks[1] = true;
          state->m_has_blocks[2] = true;
          state->m_qdxt5_params[0].m_comp_index = 0;
          state->m_qdxt5_params[1].m_comp_index = 1;
          goto LAB_0014e0bf;
        }
        if (fmt != PIXEL_FMT_DXT5_CCxY) {
          return false;
        }
      }
      state->m_has_blocks[0] = true;
      state->m_has_blocks[1] = true;
      (state->m_qdxt1_params).m_use_alpha_blocks = false;
      (state->m_qdxt1_params).m_perceptual = false;
      state->m_qdxt5_params[0].m_comp_index = 3;
    }
  }
LAB_0014e0bf:
  uVar2 = (uint)(state->m_has_blocks[0] & 1) + (uint)(state->m_has_blocks[1] & 1) +
          (uint)(state->m_has_blocks[2] & 1);
  f = dxt1_params->m_progress_start;
  if ((state->m_has_blocks[0] & 1U) != 0) {
    (state->m_qdxt1_params).m_progress_start = f;
    (state->m_qdxt1_params).m_progress_range = dxt1_params->m_progress_range / uVar2;
    f = (state->m_qdxt1_params).m_progress_range + f;
  }
  if ((state->m_has_blocks[1] & 1U) != 0) {
    state->m_qdxt5_params[0].m_progress_start = f;
    state->m_qdxt5_params[0].m_progress_range = dxt1_params->m_progress_range / uVar2;
    f = state->m_qdxt5_params[0].m_progress_range + f;
  }
  if ((state->m_has_blocks[2] & 1U) != 0) {
    state->m_qdxt5_params[1].m_progress_start = f;
    state->m_qdxt5_params[1].m_progress_range = dxt1_params->m_progress_range - f;
  }
  state->m_fmt = fmt;
  uVar3 = get_width(this);
  get_height(this);
  get_num_levels(this);
  get_num_faces(this);
  this_01 = get_name(this);
  dynamic_string::get_ptr(this_01);
  init(dst_tex,(EVP_PKEY_CTX *)(ulong)uVar3);
  vector<crnlib::dxt_pixel_block>::resize(&state->m_pixel_blocks,0,false);
  l = 0xffffffff;
  if (cook) {
    l = image_utils::get_conversion_type(true,fmt);
    bVar1 = pixel_format_helpers::is_alpha_only(fmt);
    if ((bVar1) && (bVar1 = pixel_format_helpers::has_alpha(this->m_format), !bVar1)) {
      l = 9;
    }
  }
  (state->m_qdxt1_params).m_num_mips = 0;
  state->m_qdxt5_params[0].m_num_mips = 0;
  state->m_qdxt5_params[1].m_num_mips = 0;
  for (local_50 = 0; uVar3 = get_num_faces(this), local_50 < uVar3; local_50 = local_50 + 1) {
    for (pLevel._4_4_ = 0; uVar3 = get_num_levels(this), pLevel._4_4_ < uVar3;
        pLevel._4_4_ = pLevel._4_4_ + 1) {
      this_02 = get_level(this,local_50,pLevel._4_4_);
      this_03 = get_level(dst_tex,local_50,pLevel._4_4_);
      flags = mip_level::get_orientation_flags(this_02);
      mip_level::set_orientation_flags(this_03,flags);
      this_00 = &img.m_pixel_buf.m_size;
      image<crnlib::color_quad<unsigned_char,_int>_>::image
                ((image<crnlib::color_quad<unsigned_char,_int>_> *)this_00);
      other = mip_level::get_unpacked_image(this_02,(image_u8 *)this_00,1);
      image<crnlib::color_quad<unsigned_char,_int>_>::image
                ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_c0,other);
      if (l != 0xffffffff) {
        image_utils::convert_image((image_u8 *)local_c0,l);
      }
      uVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_c0);
      uVar2 = uVar3 + 3 >> 2;
      uVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_c0);
      uVar4 = uVar3 + 3 >> 2;
      uVar3 = vector<crnlib::dxt_pixel_block>::size(&state->m_pixel_blocks);
      vector<crnlib::dxt_pixel_block>::resize(&state->m_pixel_blocks,uVar3 + uVar2 * uVar4,false);
      mip_desc = (mip_desc *)
                 vector<crnlib::dxt_pixel_block>::operator[](&state->m_pixel_blocks,uVar3);
      pmVar5 = (state->m_qdxt1_params).m_mip_desc + (state->m_qdxt1_params).m_num_mips;
      pmVar5->m_first_block = uVar3;
      pmVar5->m_block_width = uVar2;
      pmVar5->m_block_height = uVar4;
      (state->m_qdxt1_params).m_num_mips = (state->m_qdxt1_params).m_num_mips + 1;
      for (mip_desc_1._4_4_ = 0; mip_desc_1._4_4_ < 2; mip_desc_1._4_4_ = mip_desc_1._4_4_ + 1) {
        pmVar6 = state->m_qdxt5_params[mip_desc_1._4_4_].m_mip_desc +
                 state->m_qdxt5_params[mip_desc_1._4_4_].m_num_mips;
        pmVar6->m_first_block = uVar3;
        pmVar6->m_block_width = uVar2;
        pmVar6->m_block_height = uVar4;
        state->m_qdxt5_params[mip_desc_1._4_4_].m_num_mips =
             state->m_qdxt5_params[mip_desc_1._4_4_].m_num_mips + 1;
      }
      for (block_x = 0; block_x < uVar4; block_x = block_x + 1) {
        for (pDst_pixel._4_4_ = 0; pDst_pixel._4_4_ < uVar2; pDst_pixel._4_4_ = pDst_pixel._4_4_ + 1
            ) {
          _bx = mip_desc;
          mip_desc = (mip_desc *)&mip_desc[5].m_block_width;
          for (local_11c = 0; local_11c < 4; local_11c = local_11c + 1) {
            for (local_120 = 0; local_120 < 4; local_120 = local_120 + 1) {
              other_00 = image<crnlib::color_quad<unsigned_char,_int>_>::get_clamped
                                   ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_c0,
                                    pDst_pixel._4_4_ * 4 + local_120,block_x * 4 + local_11c);
              color_quad<unsigned_char,_int>::operator=
                        ((color_quad<unsigned_char,_int> *)_bx,other_00);
              _bx = (mip_desc *)&_bx->m_block_width;
            }
          }
        }
      }
      image<crnlib::color_quad<unsigned_char,_int>_>::~image
                ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_c0);
      image<crnlib::color_quad<unsigned_char,_int>_>::~image
                ((image<crnlib::color_quad<unsigned_char,_int>_> *)&img.m_pixel_buf.m_size);
    }
  }
  if ((state->m_has_blocks[0] & 1U) != 0) {
    uVar3 = vector<crnlib::dxt_pixel_block>::size(&state->m_pixel_blocks);
    vector<crnlib::dxt_pixel_block>::operator[](&state->m_pixel_blocks,0);
    uVar2 = qdxt1::init(&state->m_qdxt1,(EVP_PKEY_CTX *)(ulong)uVar3);
    if ((uVar2 & 1) == 0) {
      return false;
    }
  }
  if ((state->m_has_blocks[1] & 1U) != 0) {
    uVar3 = vector<crnlib::dxt_pixel_block>::size(&state->m_pixel_blocks);
    vector<crnlib::dxt_pixel_block>::operator[](&state->m_pixel_blocks,0);
    uVar2 = qdxt5::init(&state->m_qdxt5a,(EVP_PKEY_CTX *)(ulong)uVar3);
    if ((uVar2 & 1) == 0) {
      return false;
    }
  }
  if ((state->m_has_blocks[2] & 1U) != 0) {
    uVar3 = vector<crnlib::dxt_pixel_block>::size(&state->m_pixel_blocks);
    vector<crnlib::dxt_pixel_block>::operator[](&state->m_pixel_blocks,0);
    uVar2 = qdxt5::init(&state->m_qdxt5b,(EVP_PKEY_CTX *)(ulong)uVar3);
    if ((uVar2 & 1) == 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool mipmapped_texture::qdxt_pack_init(qdxt_state& state, mipmapped_texture& dst_tex, const qdxt1_params& dxt1_params, const qdxt5_params& dxt5_params, pixel_format fmt, bool cook) {
  if (!is_valid())
    return false;

  state.m_qdxt1_params = dxt1_params;
  state.m_qdxt5_params[0] = dxt5_params;
  state.m_qdxt5_params[1] = dxt5_params;
  utils::zero_object(state.m_has_blocks);

  switch (fmt) {
    case PIXEL_FMT_DXT1: {
      state.m_has_blocks[0] = true;
      break;
    }
    case PIXEL_FMT_DXT1A: {
      state.m_has_blocks[0] = true;
      state.m_qdxt1_params.m_use_alpha_blocks = true;
      break;
    }
    case PIXEL_FMT_DXT4:
    case PIXEL_FMT_DXT5: {
      state.m_has_blocks[0] = true;
      state.m_has_blocks[1] = true;
      state.m_qdxt1_params.m_use_alpha_blocks = false;
      state.m_qdxt5_params[0].m_comp_index = 3;
      break;
    }
    case PIXEL_FMT_DXT5_CCxY:
    case PIXEL_FMT_DXT5_xGxR:
    case PIXEL_FMT_DXT5_xGBR:
    case PIXEL_FMT_DXT5_AGBR: {
      state.m_has_blocks[0] = true;
      state.m_has_blocks[1] = true;
      state.m_qdxt1_params.m_use_alpha_blocks = false;
      state.m_qdxt1_params.m_perceptual = false;
      state.m_qdxt5_params[0].m_comp_index = 3;
      break;
    }
    case PIXEL_FMT_3DC: {
      state.m_has_blocks[1] = true;
      state.m_has_blocks[2] = true;
      state.m_qdxt5_params[0].m_comp_index = 1;
      state.m_qdxt5_params[1].m_comp_index = 0;
      break;
    }
    case PIXEL_FMT_DXN: {
      state.m_has_blocks[1] = true;
      state.m_has_blocks[2] = true;
      state.m_qdxt5_params[0].m_comp_index = 0;
      state.m_qdxt5_params[1].m_comp_index = 1;
      break;
    }
    case PIXEL_FMT_DXT5A: {
      state.m_has_blocks[1] = true;
      state.m_qdxt5_params[0].m_comp_index = 3;
      break;
    }
    case PIXEL_FMT_ETC1:
    case PIXEL_FMT_ETC2:
    case PIXEL_FMT_ETC2A:
    case PIXEL_FMT_ETC1S:
    case PIXEL_FMT_ETC2AS: {
      console::warning("mipmapped_texture::qdxt_pack_init: This method does not support ETCn");
      return false;
    }
    default: {
      CRNLIB_ASSERT(0);
      return false;
    }
  }

  const uint num_elements = state.m_has_blocks[0] + state.m_has_blocks[1] + state.m_has_blocks[2];

  uint cur_progress_start = dxt1_params.m_progress_start;
  if (state.m_has_blocks[0]) {
    state.m_qdxt1_params.m_progress_start = cur_progress_start;
    state.m_qdxt1_params.m_progress_range = dxt1_params.m_progress_range / num_elements;
    cur_progress_start += state.m_qdxt1_params.m_progress_range;
  }

  if (state.m_has_blocks[1]) {
    state.m_qdxt5_params[0].m_progress_start = cur_progress_start;
    state.m_qdxt5_params[0].m_progress_range = dxt1_params.m_progress_range / num_elements;
    cur_progress_start += state.m_qdxt5_params[0].m_progress_range;
  }

  if (state.m_has_blocks[2]) {
    state.m_qdxt5_params[1].m_progress_start = cur_progress_start;
    state.m_qdxt5_params[1].m_progress_range = dxt1_params.m_progress_range - cur_progress_start;
  }

  state.m_fmt = fmt;

  dst_tex.init(get_width(), get_height(), get_num_levels(), get_num_faces(), fmt, get_name().get_ptr(), cDefaultOrientationFlags);

  state.m_pixel_blocks.resize(0);

  image_utils::conversion_type cook_conv_type = image_utils::cConversion_Invalid;
  if (cook) {
    cook_conv_type = image_utils::get_conversion_type(true, fmt);
    if (pixel_format_helpers::is_alpha_only(fmt) && !pixel_format_helpers::has_alpha(m_format))
      cook_conv_type = image_utils::cConversion_Y_To_A;
  }

  state.m_qdxt1_params.m_num_mips = 0;
  state.m_qdxt5_params[0].m_num_mips = 0;
  state.m_qdxt5_params[1].m_num_mips = 0;

  for (uint f = 0; f < get_num_faces(); f++) {
    for (uint l = 0; l < get_num_levels(); l++) {
      mip_level* pLevel = get_level(f, l);

      dst_tex.get_level(f, l)->set_orientation_flags(pLevel->get_orientation_flags());

      image_u8 tmp_img;
      image_u8 img(*pLevel->get_unpacked_image(tmp_img, cUnpackFlagUncook));

      if (cook_conv_type != image_utils::cConversion_Invalid)
        image_utils::convert_image(img, cook_conv_type);

      const uint num_blocks_x = (img.get_width() + 3) / 4;
      const uint num_blocks_y = (img.get_height() + 3) / 4;
      const uint total_blocks = num_blocks_x * num_blocks_y;

      const uint cur_size = state.m_pixel_blocks.size();
      state.m_pixel_blocks.resize(cur_size + total_blocks);
      dxt_pixel_block* pDst_blocks = &state.m_pixel_blocks[cur_size];

      {
        CRNLIB_ASSERT(state.m_qdxt1_params.m_num_mips < qdxt1_params::cMaxMips);
        qdxt1_params::mip_desc& mip_desc = state.m_qdxt1_params.m_mip_desc[state.m_qdxt1_params.m_num_mips];
        mip_desc.m_first_block = cur_size;
        mip_desc.m_block_width = num_blocks_x;
        mip_desc.m_block_height = num_blocks_y;
        state.m_qdxt1_params.m_num_mips++;
      }

      for (uint i = 0; i < 2; i++) {
        CRNLIB_ASSERT(state.m_qdxt5_params[i].m_num_mips < qdxt5_params::cMaxMips);
        qdxt5_params::mip_desc& mip_desc = state.m_qdxt5_params[i].m_mip_desc[state.m_qdxt5_params[i].m_num_mips];
        mip_desc.m_first_block = cur_size;
        mip_desc.m_block_width = num_blocks_x;
        mip_desc.m_block_height = num_blocks_y;
        state.m_qdxt5_params[i].m_num_mips++;
      }

      for (uint block_y = 0; block_y < num_blocks_y; block_y++) {
        const uint img_y = block_y << 2;

        for (uint block_x = 0; block_x < num_blocks_x; block_x++) {
          const uint img_x = block_x << 2;

          color_quad_u8* pDst_pixel = &pDst_blocks->m_pixels[0][0];

          pDst_blocks++;

          for (uint by = 0; by < 4; by++)
            for (uint bx = 0; bx < 4; bx++)
              *pDst_pixel++ = img.get_clamped(img_x + bx, img_y + by);
        }  // block_x
      }    // block_y
    }      // l
  }        // f

  if (state.m_has_blocks[0]) {
    if (!state.m_qdxt1.init(state.m_pixel_blocks.size(), &state.m_pixel_blocks[0], state.m_qdxt1_params))
      return false;
  }

  if (state.m_has_blocks[1]) {
    if (!state.m_qdxt5a.init(state.m_pixel_blocks.size(), &state.m_pixel_blocks[0], state.m_qdxt5_params[0]))
      return false;
  }

  if (state.m_has_blocks[2]) {
    if (!state.m_qdxt5b.init(state.m_pixel_blocks.size(), &state.m_pixel_blocks[0], state.m_qdxt5_params[1]))
      return false;
  }

  return true;
}